

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::BridgeState>::DeleteAll(MemoryPool<despot::BridgeState> *this)

{
  Chunk *this_00;
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<despot::MemoryPool<despot::BridgeState>::Chunk_**,_std::vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>_>
  local_20;
  __normal_iterator<despot::MemoryPool<despot::BridgeState>::Chunk_**,_std::vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>_>
  local_18;
  chunk_iterator_ i_chunk;
  MemoryPool<despot::BridgeState> *this_local;
  
  i_chunk._M_current = (Chunk **)this;
  local_18._M_current =
       (Chunk **)
       std::
       vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
       ::begin(&this->chunks_);
  while( true ) {
    local_20._M_current =
         (Chunk **)
         std::
         vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
         ::end(&this->chunks_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<despot::MemoryPool<despot::BridgeState>::Chunk_**,_std::vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (Chunk *)0x0) {
      Chunk::~Chunk(this_00);
      operator_delete(this_00,0x2800);
    }
    __gnu_cxx::
    __normal_iterator<despot::MemoryPool<despot::BridgeState>::Chunk_**,_std::vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<despot::MemoryPool<despot::BridgeState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::BridgeState>::Chunk_*>_>
  ::clear(&this->chunks_);
  std::vector<despot::BridgeState_*,_std::allocator<despot::BridgeState_*>_>::clear
            (&this->freelist_);
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}